

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

int __thiscall
QTextDocumentPrivate::insertBlock
          (QTextDocumentPrivate *this,QChar blockSeparator,int pos,int blockFormat,int charFormat,
          Operation op)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  QTextBlockData *pQVar5;
  uint in_EDX;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  int in_stack_00000010;
  QTextBlockData *B;
  int b;
  int fragment;
  int oldRevision;
  bool atBlockStart;
  bool atBlockEnd;
  int ob;
  int strPos;
  QTextUndoCommand c;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  QTextDocumentPrivate *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar8;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint local_68;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  QTextDocumentPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  beginEditBlock(in_RDI);
  QString::size(&in_RDI->text);
  QString::append((QChar)((short)in_RDI + L'\x80'));
  uVar2 = QFragmentMap<QTextBlockData>::findNode
                    ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  bVar6 = true;
  bVar7 = true;
  local_68 = 0;
  if (uVar2 != 0) {
    in_stack_ffffffffffffff78 = in_EDX;
    uVar2 = QFragmentMap<QTextBlockData>::position
                      ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff7c = in_stack_ffffffffffffff78 - uVar2;
    uVar2 = QFragmentMap<QTextBlockData>::size
                      ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    bVar6 = in_stack_ffffffffffffff7c == uVar2 - 1;
    uVar2 = QFragmentMap<QTextBlockData>::position
                      ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    bVar7 = uVar2 == in_EDX;
    pQVar5 = QFragmentMap<QTextBlockData>::fragment
                       ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
    local_68 = (*(int *)&pQVar5->field_0x44 << 1) >> 1;
  }
  uVar2 = 5;
  iVar3 = insert_block(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                       (uint)in_stack_ffffffffffffffd0,
                       (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8,
                       (Operation)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_00000010);
  QFragmentMap<QTextBlockData>::findNode
            ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
             uVar2);
  pQVar5 = QFragmentMap<QTextBlockData>::fragment
                     ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                      in_stack_ffffffffffffff5c);
  appendUndoItem((QTextDocumentPrivate *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (QTextUndoCommand *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if ((!bVar6) || (uVar8 = local_68, bVar7)) {
    uVar8 = in_RDI->revision;
  }
  *(uint *)&pQVar5->field_0x44 = *(uint *)&pQVar5->field_0x44 & 0x80000000 | uVar8 & 0x7fffffff;
  uVar2 = QFragmentMap<QTextBlockData>::next
                    ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff5c);
  if (uVar2 != 0) {
    pQVar5 = QFragmentMap<QTextBlockData>::fragment
                       ((QFragmentMap<QTextBlockData> *)in_stack_ffffffffffffff60,
                        in_stack_ffffffffffffff5c);
    if (!bVar7) {
      local_68 = in_RDI->revision;
    }
    *(uint *)&pQVar5->field_0x44 = *(uint *)&pQVar5->field_0x44 & 0x80000000 | local_68 & 0x7fffffff
    ;
    in_stack_ffffffffffffff70 = local_68;
  }
  QTextFormatCollection::charFormat
            ((QTextFormatCollection *)CONCAT44(uVar8,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  iVar4 = QTextFormat::objectIndex((QTextFormat *)CONCAT44(uVar8,in_stack_ffffffffffffff70));
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7d257f);
  if (iVar4 == -1) {
    in_RDI->field_0x294 = in_RDI->field_0x294 & 0xfe | 1;
  }
  endEditBlock(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QTextDocumentPrivate::insertBlock(QChar blockSeparator,
                                  int pos, int blockFormat, int charFormat, QTextUndoCommand::Operation op)
{
    Q_ASSERT(formats.format(blockFormat).isBlockFormat());
    Q_ASSERT(formats.format(charFormat).isCharFormat());
    Q_ASSERT(pos >= 0 && (pos < fragments.length() || (pos == 0 && fragments.length() == 0)));
    Q_ASSERT(isValidBlockSeparator(blockSeparator));

    beginEditBlock();

    int strPos = text.size();
    text.append(blockSeparator);

    int ob = blocks.findNode(pos);
    bool atBlockEnd = true;
    bool atBlockStart = true;
    int oldRevision = 0;
    if (ob) {
        atBlockEnd = (pos - blocks.position(ob) == blocks.size(ob)-1);
        atBlockStart = ((int)blocks.position(ob) == pos);
        oldRevision = blocks.fragment(ob)->revision;
    }

    const int fragment = insert_block(pos, strPos, charFormat, blockFormat, op, QTextUndoCommand::BlockRemoved);

    Q_ASSERT(blocks.length() == fragments.length());

    int b = blocks.findNode(pos);
    QTextBlockData *B = blocks.fragment(b);

    QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockInserted, (editBlock != 0),
                            op, charFormat, strPos, pos, blockFormat,
                            B->revision);

    appendUndoItem(c);
    Q_ASSERT(undoState == undoStack.size());

    // update revision numbers of the modified blocks.
    B->revision = (atBlockEnd && !atBlockStart)? oldRevision : revision;
    b = blocks.next(b);
    if (b) {
        B = blocks.fragment(b);
        B->revision = atBlockStart ? oldRevision : revision;
    }

    if (formats.charFormat(charFormat).objectIndex() == -1)
        needsEnsureMaximumBlockCount = true;

    endEditBlock();
    return fragment;
}